

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<int,int,int,duckdb::BinaryLambdaWrapper,bool,int(*)(int,int)>
               (Vector *left,Vector *right,Vector *result,_func_int_int_int *fun)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  _func_int_int_int *fun_00;
  int *piVar4;
  idx_t in_RCX;
  Vector *in_RDX;
  int *result_data;
  int *rdata;
  int *ldata;
  int iVar5;
  
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  piVar3 = ConstantVector::GetData<int>((Vector *)0x4ddce1);
  fun_00 = (_func_int_int_int *)ConstantVector::GetData<int>((Vector *)0x4ddcf0);
  piVar4 = ConstantVector::GetData<int>((Vector *)0x4ddcff);
  bVar1 = ConstantVector::IsNull((Vector *)0x4ddd0e);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x4ddd1c), !bVar1)) {
    iVar2 = *piVar3;
    iVar5 = *(int *)fun_00;
    ConstantVector::Validity(in_RDX);
    iVar2 = BinaryLambdaWrapper::Operation<int(*)(int,int),bool,int,int,int>
                      (fun_00,(int)((ulong)piVar4 >> 0x20),(int)piVar4,
                       (ValidityMask *)CONCAT44(iVar5,iVar2),in_RCX);
    *piVar4 = iVar2;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}